

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O2

pattern * getPat(char *line,char *which,int verbose)

{
  pattern *pat;
  
  if (line == (char *)0x0) {
    pat = (pattern *)0x0;
  }
  else {
    pat = parseArg(line);
    if (pat != (pattern *)0x0 && verbose != 0) {
      fprintf(_stderr,"%s: ",which);
      printPattern((FILE *)_stderr,pat);
    }
  }
  return pat;
}

Assistant:

pattern* getPat(char *line, char *which, int verbose)
{
   pattern *pat;

   if (!line) return NULL;

   pat = parseArg(line);  /* parse.c/parseArg() */

   if (verbose && pat) {
      fprintf(stderr, "%s: ", which);
      printPattern(stderr, pat); /* parse.c/printPattern() */
   }

   return pat;
}